

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

void tlb_flush_by_mmuidx_async_work(CPUState *cpu,run_on_cpu_data data)

{
  ushort uVar1;
  CPUArchState_conflict28 *env_00;
  size_t sVar2;
  ushort uVar3;
  ushort val;
  int iVar4;
  int64_t now_00;
  CPUTLB_conflict5 *pCVar5;
  int mmu_idx;
  int64_t now;
  uint16_t to_clean;
  uint16_t work;
  uint16_t all_dirty;
  uint16_t asked;
  CPUArchState_conflict28 *env;
  CPUState *cpu_local;
  run_on_cpu_data data_local;
  
  env_00 = (CPUArchState_conflict28 *)cpu->env_ptr;
  uVar3 = (ushort)data.host_ulong;
  now_00 = get_clock_realtime();
  pCVar5 = env_tlb(env_00);
  uVar1 = (pCVar5->c).dirty;
  val = uVar3 & uVar1;
  pCVar5 = env_tlb(env_00);
  (pCVar5->c).dirty = uVar1 & (val ^ 0xffff);
  for (now._2_2_ = val; now._2_2_ != 0; now._2_2_ = now._2_2_ & now._2_2_ - 1) {
    iVar4 = ctz32((uint)now._2_2_);
    tlb_flush_one_mmuidx_locked(env_00,iVar4,now_00);
  }
  cpu_tb_jmp_cache_clear(cpu);
  if (val == 7) {
    pCVar5 = env_tlb(env_00);
    sVar2 = (pCVar5->c).full_flush_count;
    pCVar5 = env_tlb(env_00);
    (pCVar5->c).full_flush_count = sVar2 + 1;
  }
  else {
    pCVar5 = env_tlb(env_00);
    sVar2 = (pCVar5->c).part_flush_count;
    iVar4 = ctpop16(val);
    pCVar5 = env_tlb(env_00);
    (pCVar5->c).part_flush_count = sVar2 + (long)iVar4;
    if (val != uVar3) {
      pCVar5 = env_tlb(env_00);
      sVar2 = (pCVar5->c).elide_flush_count;
      iVar4 = ctpop16(uVar3 & (val ^ 0xffff));
      pCVar5 = env_tlb(env_00);
      (pCVar5->c).elide_flush_count = sVar2 + (long)iVar4;
    }
  }
  return;
}

Assistant:

static void tlb_flush_by_mmuidx_async_work(CPUState *cpu, run_on_cpu_data data)
{
    CPUArchState *env = cpu->env_ptr;
    uint16_t asked = data.host_int;
    uint16_t all_dirty, work, to_clean;
    int64_t now = get_clock_realtime();

    all_dirty = env_tlb(env)->c.dirty;
    to_clean = asked & all_dirty;
    all_dirty &= ~to_clean;
    env_tlb(env)->c.dirty = all_dirty;

    for (work = to_clean; work != 0; work &= work - 1) {
        int mmu_idx = ctz32(work);
        tlb_flush_one_mmuidx_locked(env, mmu_idx, now);
    }

    cpu_tb_jmp_cache_clear(cpu);

    if (to_clean == ALL_MMUIDX_BITS) {
        env_tlb(env)->c.full_flush_count = env_tlb(env)->c.full_flush_count + 1;
    } else {
        env_tlb(env)->c.part_flush_count = env_tlb(env)->c.part_flush_count + ctpop16(to_clean);
        if (to_clean != asked) {
            env_tlb(env)->c.elide_flush_count = env_tlb(env)->c.elide_flush_count + ctpop16(asked & ~to_clean);
        }
    }
}